

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O2

size_t __thiscall
iDynTree::SensorsMeasurements::getNrOfSensors(SensorsMeasurements *this,SensorType *sensor_type)

{
  pointer *ppWVar1;
  SensorsMeasurementsPrivateAttributes *pSVar2;
  long lStack_8;
  
  switch(*sensor_type) {
  case SIX_AXIS_FORCE_TORQUE:
    pSVar2 = this->pimpl;
    ppWVar1 = &(pSVar2->SixAxisFTSensorsMeasurements).
               super__Vector_base<iDynTree::Wrench,_std::allocator<iDynTree::Wrench>_>._M_impl.
               super__Vector_impl_data._M_finish;
    lStack_8 = 0x38;
    goto LAB_001bf468;
  case ACCELEROMETER:
    pSVar2 = (SensorsMeasurementsPrivateAttributes *)&this->pimpl->AccelerometerMeasurements;
    ppWVar1 = (pointer *)
              &(this->pimpl->AccelerometerMeasurements).
               super__Vector_base<iDynTree::GeomVector3,_std::allocator<iDynTree::GeomVector3>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    break;
  case GYROSCOPE:
    pSVar2 = (SensorsMeasurementsPrivateAttributes *)&this->pimpl->GyroscopeMeasurements;
    ppWVar1 = (pointer *)
              &(this->pimpl->GyroscopeMeasurements).
               super__Vector_base<iDynTree::GeomVector3,_std::allocator<iDynTree::GeomVector3>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    break;
  case THREE_AXIS_ANGULAR_ACCELEROMETER:
    pSVar2 = (SensorsMeasurementsPrivateAttributes *)
             &this->pimpl->ThreeAxisAngularAccelerometerMeasurements;
    ppWVar1 = (pointer *)
              &(this->pimpl->ThreeAxisAngularAccelerometerMeasurements).
               super__Vector_base<iDynTree::VectorFixSize<3U>,_std::allocator<iDynTree::VectorFixSize<3U>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    break;
  case THREE_AXIS_FORCE_TORQUE_CONTACT:
    pSVar2 = (SensorsMeasurementsPrivateAttributes *)
             &this->pimpl->ThreeAxisForceTorqueContactMeasurements;
    ppWVar1 = (pointer *)
              &(this->pimpl->ThreeAxisForceTorqueContactMeasurements).
               super__Vector_base<iDynTree::VectorFixSize<3U>,_std::allocator<iDynTree::VectorFixSize<3U>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    break;
  default:
    return 0;
  }
  lStack_8 = 0x18;
LAB_001bf468:
  return ((long)*ppWVar1 -
         (long)(pSVar2->SixAxisFTSensorsMeasurements).
               super__Vector_base<iDynTree::Wrench,_std::allocator<iDynTree::Wrench>_>._M_impl.
               super__Vector_impl_data._M_start) / lStack_8;
}

Assistant:

std::size_t SensorsMeasurements::getNrOfSensors(const SensorType& sensor_type) const
{
    std::size_t returnVal = 0;
    switch (sensor_type)
    {
        case SIX_AXIS_FORCE_TORQUE :
            returnVal =  this->pimpl->SixAxisFTSensorsMeasurements.size();
            break;
        case ACCELEROMETER :
            returnVal =  this->pimpl->AccelerometerMeasurements.size();
            break;
        case GYROSCOPE :
            returnVal =  this->pimpl->GyroscopeMeasurements.size();
            break;
        case THREE_AXIS_ANGULAR_ACCELEROMETER :
            returnVal =  this->pimpl->ThreeAxisAngularAccelerometerMeasurements.size();
            break;
        case THREE_AXIS_FORCE_TORQUE_CONTACT :
            returnVal =  this->pimpl->ThreeAxisForceTorqueContactMeasurements.size();
            break;
        default :
            returnVal = 0;
    }
    return(returnVal);
}